

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void remove_zero_pad(double *Y,int rows,int cols,int zrow,int zcol,double *Z)

{
  int v;
  int u;
  int j;
  int i;
  int c;
  int r;
  double *Z_local;
  int zcol_local;
  int zrow_local;
  int cols_local;
  int rows_local;
  double *Y_local;
  
  for (u = 0; u < rows - zrow; u = u + 1) {
    for (v = 0; v < cols - zcol; v = v + 1) {
      Z[v + u * (cols - zcol)] = Y[v + u * cols];
    }
  }
  return;
}

Assistant:

void remove_zero_pad(double *Y, int rows, int cols, int zrow, int zcol,double *Z) {
	int r,c,i,j,u,v;
	r = rows - zrow;
	c = cols - zcol;
	
	for (i = 0; i < r; ++i) {
		u = i * c;
		v = i * cols;
		for (j = 0; j < c; ++j) {
			Z[j + u] = Y[j + v];
		}
	}
}